

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O0

bool ON_WriteMultipleObjectArchive
               (ON_BinaryArchive *archive,int version,size_t object_list_count,
               ON_Object **object_list)

{
  int iVar1;
  ON_Layer *this;
  ON_BrepEdge *pOVar2;
  ON_BrepTrim *pOVar3;
  ON_BrepLoop *pOVar4;
  ON_BrepFace *pOVar5;
  ON_CurveProxy *pOVar6;
  ON_SurfaceProxy *pOVar7;
  ON_3dmObjectAttributes *this_00;
  ON_UUID OVar8;
  undefined1 local_c30 [7];
  bool rc;
  ON_ModelGeometryComponent *local_c20;
  ON_ModelGeometryComponent *mg;
  ON_wString OStack_c10;
  ON_wString local_c08;
  ON_3dmObjectAttributes *attributes;
  bool bManageAttributes;
  ON_Brep *pOStack_bf8;
  bool bManageGeometry;
  ON_Geometry *geometry;
  size_t object_index;
  ON_Layer *local_bd8;
  ON_Layer *layer;
  undefined1 local_bb9;
  undefined1 local_bb8 [7];
  bool bResolveIdAndNameConflicts;
  ONX_Model model;
  ON_Object **object_list_local;
  size_t object_list_count_local;
  int version_local;
  ON_BinaryArchive *archive_local;
  
  if ((object_list_count == 0) || (object_list == (ON_Object **)0x0)) {
    archive_local._7_1_ = false;
  }
  else {
    model.m_model_user_string_list = (ON_DocumentUserStringList *)object_list;
    ONX_Model::ONX_Model((ONX_Model *)local_bb8);
    local_bb9 = 1;
    ON_3dmRevisionHistory::NewRevision((ON_3dmRevisionHistory *)&model.m_sStartSectionComments);
    ON_UnitSystem::SetUnitSystem
              ((ON_UnitSystem *)&model.m_settings.m_earth_anchor_point.m_url_tag,None);
    this = (ON_Layer *)operator_new(0xe8);
    ON_Layer::ON_Layer(this,&ON_Layer::Default);
    local_bd8 = this;
    ON_ModelComponent::SetId((ON_ModelComponent *)this);
    ON_ModelComponent::SetIndex(&local_bd8->super_ON_ModelComponent,0);
    ONX_Model::AddManagedModelComponent
              ((ONX_Model *)&object_index,(ON_ModelComponent *)local_bb8,SUB81(local_bd8,0));
    ON_ModelComponentReference::~ON_ModelComponentReference
              ((ON_ModelComponentReference *)&object_index);
    for (geometry = (ON_Geometry *)0x0; geometry < object_list_count;
        geometry = (ON_Geometry *)((long)&(geometry->super_ON_Object)._vptr_ON_Object + 1)) {
      pOStack_bf8 = (ON_Brep *)
                    ON_Geometry::Cast((ON_Object *)
                                      (&((model.m_model_user_string_list)->super_ON_Object).
                                        _vptr_ON_Object)[(long)geometry]);
      pOVar2 = ON_BrepEdge::Cast((ON_Object *)pOStack_bf8);
      if (pOVar2 == (ON_BrepEdge *)0x0) {
        pOVar3 = ON_BrepTrim::Cast((ON_Object *)pOStack_bf8);
        if (pOVar3 == (ON_BrepTrim *)0x0) {
          pOVar4 = ON_BrepLoop::Cast((ON_Object *)pOStack_bf8);
          if (pOVar4 == (ON_BrepLoop *)0x0) {
            pOVar5 = ON_BrepFace::Cast((ON_Object *)pOStack_bf8);
            if (pOVar5 == (ON_BrepFace *)0x0) {
              pOVar6 = ON_CurveProxy::Cast((ON_Object *)pOStack_bf8);
              if (pOVar6 == (ON_CurveProxy *)0x0) {
                pOVar7 = ON_SurfaceProxy::Cast((ON_Object *)pOStack_bf8);
                if (pOVar7 != (ON_SurfaceProxy *)0x0) {
                  pOStack_bf8 = (ON_Brep *)
                                ON_SurfaceProxy::ProxySurface((ON_SurfaceProxy *)pOStack_bf8);
                }
              }
              else {
                pOStack_bf8 = (ON_Brep *)ON_CurveProxy::ProxyCurve((ON_CurveProxy *)pOStack_bf8);
              }
            }
            else {
              pOStack_bf8 = ON_BrepFace::Brep((ON_BrepFace *)pOStack_bf8);
            }
          }
          else {
            pOStack_bf8 = ON_BrepLoop::Brep((ON_BrepLoop *)pOStack_bf8);
          }
        }
        else {
          pOStack_bf8 = (ON_Brep *)0x0;
        }
      }
      else {
        pOStack_bf8 = ON_BrepEdge::Brep((ON_BrepEdge *)pOStack_bf8);
      }
      if (pOStack_bf8 != (ON_Brep *)0x0) {
        attributes._7_1_ = 0;
        attributes._6_1_ = 1;
        this_00 = (ON_3dmObjectAttributes *)operator_new(0x170);
        ON_3dmObjectAttributes::ON_3dmObjectAttributes(this_00);
        local_c08.m_s = (wchar_t *)this_00;
        iVar1 = ON_ModelComponent::Index(&local_bd8->super_ON_ModelComponent);
        local_c08.m_s[0xc] = iVar1;
        OVar8 = ON_CreateId();
        OStack_c10.m_s = (wchar_t *)OVar8.Data4;
        mg = OVar8._0_8_;
        *(ON_UUID *)(local_c08.m_s + 4) = OVar8;
        local_c20 = ON_ModelGeometryComponent::CreateForExperts
                              (false,(ON_Object *)pOStack_bf8,true,
                               (ON_3dmObjectAttributes *)local_c08.m_s,
                               (ON_ModelGeometryComponent *)0x0);
        if (local_c20 == (ON_ModelGeometryComponent *)0x0) {
          if ((ON_3dmObjectAttributes *)local_c08.m_s != (ON_3dmObjectAttributes *)0x0) {
            (**(code **)(*(long *)local_c08.m_s + 0x20))();
          }
        }
        else {
          ONX_Model::AddManagedModelComponent
                    ((ONX_Model *)local_c30,(ON_ModelComponent *)local_bb8,SUB81(local_c20,0));
          ON_ModelComponentReference::~ON_ModelComponentReference
                    ((ON_ModelComponentReference *)local_c30);
        }
      }
    }
    if (((version % 10 != 0) ||
        (iVar1 = ON_BinaryArchive::CurrentArchiveVersion(), version < iVar1 + -10)) ||
       (iVar1 = ON_BinaryArchive::CurrentArchiveVersion(), object_list_count_local._4_4_ = version,
       iVar1 < version)) {
      object_list_count_local._4_4_ = ON_BinaryArchive::CurrentArchiveVersion();
    }
    ON_String::operator=
              ((ON_String *)&model.m_3dm_file_byte_count,
               "Archive created by ON_WriteMultipleObjectArchive");
    archive_local._7_1_ =
         ONX_Model::Write((ONX_Model *)local_bb8,archive,object_list_count_local._4_4_,
                          (ON_TextLog *)0x0);
    ONX_Model::~ONX_Model((ONX_Model *)local_bb8);
  }
  return archive_local._7_1_;
}

Assistant:

bool ON_WriteMultipleObjectArchive( 
          ON_BinaryArchive& archive,
          int version,
					size_t object_list_count,
          const ON_Object* const* object_list
          )
{
  if (object_list_count <= 0 || nullptr == object_list)
    return false;

  ONX_Model model;

  const bool bResolveIdAndNameConflicts = true;

  model.m_properties.m_RevisionHistory.NewRevision();
  
  // 1 Feb 2012 Dale Lear 
  //   http://dev.mcneel.com/bugtrack/?q=98543
  //   These simple object archives have no unit system so they
  //   can be read into a file with no scaling.  Prior to
  //   today the unit system was always millimeters.
  model.m_settings.m_ModelUnitsAndTolerances.m_unit_system.SetUnitSystem( ON::LengthUnitSystem::None );

  ON_Layer* layer = new ON_Layer(ON_Layer::Default);
  layer->SetId();
  layer->SetIndex(0);
  model.AddManagedModelComponent(layer, bResolveIdAndNameConflicts);

  for (size_t object_index = 0; object_index < object_list_count; object_index++)
  {
		const ON_Geometry* geometry = ON_Geometry::Cast(object_list[object_index]);
		if ( ON_BrepEdge::Cast(geometry) )
		{
			// write parent brep
			geometry = static_cast<const ON_BrepEdge*>(geometry)->Brep();
		}
		else if ( ON_BrepTrim::Cast(geometry) )
		{
			geometry = nullptr;
		}
		else if ( ON_BrepLoop::Cast(geometry) )
		{
			geometry = static_cast<const ON_BrepLoop*>(geometry)->Brep();
		}
		else if ( ON_BrepFace::Cast(geometry) )
		{
			// write parent brep
			geometry = static_cast<const ON_BrepFace*>(geometry)->Brep();
		}
		else if ( ON_CurveProxy::Cast(geometry) )
		{
			// write actual curve
			geometry = static_cast<const ON_CurveProxy*>(geometry)->ProxyCurve();
		}
		else if ( ON_SurfaceProxy::Cast(geometry) )
		{
			// write actual surface
			geometry = static_cast<const ON_SurfaceProxy*>(geometry)->ProxySurface();
		}

    if (nullptr == geometry)
      continue;

    // bManageGeometry = false means ~ON_ModelGeometryComponent will not delete geometry
    const bool bManageGeometry = false;
    const bool bManageAttributes = true;
    ON_3dmObjectAttributes* attributes = new ON_3dmObjectAttributes();
    attributes->m_layer_index = layer->Index();
    attributes->m_uuid = ON_CreateId();
    ON_ModelGeometryComponent* mg = ON_ModelGeometryComponent::CreateForExperts(
      bManageGeometry,
      const_cast<ON_Geometry*>(geometry), // safe - see bManageGeometry = false comment above.
      bManageAttributes,
      attributes,
      nullptr
    );

    if (nullptr == mg)
    {
      delete attributes;
      continue;
    }

    model.AddManagedModelComponent( mg, bResolveIdAndNameConflicts );
  }

  if ( (0 != version % 10)
    || version < ON_BinaryArchive::CurrentArchiveVersion() - 10
    || version > ON_BinaryArchive::CurrentArchiveVersion()
    )
  {
    version = ON_BinaryArchive::CurrentArchiveVersion();
  }
  model.m_sStartSectionComments = "Archive created by ON_WriteMultipleObjectArchive";
  bool rc = model.Write(archive, version );

  return rc;
}